

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_asr_16_al(void)

{
  uint address;
  uint uVar1;
  undefined4 local_14;
  uint res;
  uint src;
  uint ea;
  
  address = m68ki_read_imm_32();
  uVar1 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  local_14 = uVar1 >> 1;
  if ((uVar1 & 0x8000) != 0) {
    local_14 = local_14 | 0x8000;
  }
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,local_14);
  m68ki_cpu.n_flag = local_14 >> 8;
  m68ki_cpu.not_z_flag = local_14;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.x_flag = uVar1 << 8;
  m68ki_cpu.c_flag = uVar1 << 8;
  return;
}

Assistant:

static void m68k_op_asr_16_al(void)
{
	uint ea = EA_AL_16();
	uint src = m68ki_read_16(ea);
	uint res = src >> 1;

	if(GET_MSB_16(src))
		res |= 0x8000;

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = FLAG_X = src << 8;
}